

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absolute.cpp
# Opt level: O2

string * fs_absolute_abi_cxx11_
                   (string *__return_storage_ptr__,string_view path,string_view base,
                   bool expand_tilde)

{
  bool bVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type *psVar3;
  size_t sVar4;
  undefined3 in_register_00000089;
  string_view path_00;
  string local_78;
  string ex;
  string_view path_local;
  
  path_local._M_str = path._M_str;
  sVar4 = path._M_len;
  path_local._M_len = sVar4;
  if (CONCAT31(in_register_00000089,expand_tilde) == 0) {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&ex,&path_local,(allocator<char> *)&local_78);
    sVar4 = path_local._M_len;
  }
  else {
    fs_expanduser_abi_cxx11_(&ex,path);
  }
  if ((ex._M_string_length == 0) && (sVar4 != 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    path_00._M_str = ex._M_dataplus._M_p;
    path_00._M_len = ex._M_string_length;
    bVar1 = fs_is_absolute(path_00);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ex);
    }
    else {
      fs_absolute_abi_cxx11_(&local_78,base,expand_tilde);
      if (local_78._M_string_length == 0) {
        paVar2 = &__return_storage_ptr__->field_2;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar2;
        psVar3 = &__return_storage_ptr__->_M_string_length;
      }
      else {
        if (ex._M_string_length != 0) {
          if (local_78._M_dataplus._M_p[local_78._M_string_length - 1] != '/') {
            std::__cxx11::string::push_back((char)&local_78);
          }
          std::__cxx11::string::append((string *)&local_78);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        paVar2 = &local_78.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p == paVar2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               local_78.field_2._M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_78.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = local_78._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               local_78.field_2._M_allocated_capacity;
        }
        psVar3 = &local_78._M_string_length;
        __return_storage_ptr__->_M_string_length = local_78._M_string_length;
        local_78._M_dataplus._M_p = (pointer)paVar2;
      }
      *psVar3 = 0;
      paVar2->_M_local_buf[0] = '\0';
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  std::__cxx11::string::~string((string *)&ex);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_absolute(std::string_view path, std::string_view base, const bool expand_tilde)
{
  // rebase path on base.

  const std::string ex = expand_tilde
    ? fs_expanduser(path)
    : std::string(path);

  if (ex.empty() && !path.empty()) FFS_UNLIKELY
    return {};

  if(fs_is_absolute(ex))
    return ex;

  std::string b = fs_absolute(base, expand_tilde);
  if(b.empty())  FFS_UNLIKELY
    return {};

  if(!ex.empty()){
    if(b.back() != '/')
      b.push_back('/');

    // don't need join(). Keeps it like Python pathlib.Path.absolute()
    b.append(ex);
  }

  return b;
}